

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall gl4cts::TextureViewTestViewClasses::initTest(TextureViewTestViewClasses *this)

{
  int iVar1;
  deUint32 dVar2;
  GLuint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  Functions *gl;
  TextureViewTestViewClasses *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar5 + 0x6c8))(1,&this->m_bo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1b1a);
  GVar3 = (**(code **)(lVar5 + 0x3c8))();
  this->m_po_id = GVar3;
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1b1d);
  (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGenVertexArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1b20);
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1b23);
  (**(code **)(lVar5 + 0x10))(this->m_po_id,this->m_vs_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glAttachShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1b27);
  (**(code **)(lVar5 + 0x40))(0x8c8e,this->m_bo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1b2d);
  (**(code **)(lVar5 + 0x48))(0x8c8e,0,this->m_bo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1b30);
  (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glBindVertexArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1b34);
  (**(code **)(lVar5 + 0xff0))(0xd05,1);
  (**(code **)(lVar5 + 0xff0))(0xcf5,1);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glPixelStorei() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1b39);
  (**(code **)(lVar5 + 0x5e0))(0x8c89);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glEnable(GL_RASTERIZER_DISCARD) call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1b3d);
  return;
}

Assistant:

void TextureViewTestViewClasses::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate objects that will be used by all test iterations.
	 *
	 * Note that we're not generating texture objects here. This is owing to the fact
	 * we'll be using immutable textures and it makes more sense to generate the objects
	 * in initTexture() instead.
	 **/
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Attach the vertex shader to the program object */
	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

	/* Configure general buffer object binding. Indiced bindings will be configured
	 * in initProgramObject()
	 */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	/* Bind the VAO */
	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Modify pack & unpack alignment settings */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei() call(s) failed.");

	/* Disable rasterizatino */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed.");
}